

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_> * __thiscall
capnp::compiler::anon_unknown_0::
ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
::operator()(Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_>
             *__return_storage_ptr__,
            ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
            *this,Located<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader>
                  *items)

{
  uint uVar1;
  uint uVar2;
  ErrorReporter *pEVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *pMVar9;
  Reader *pRVar10;
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *value;
  size_t size;
  Iterator IVar11;
  Iterator IVar12;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar13;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  StringPtr local_2f0;
  StringPtr local_2e0;
  Reader *local_2d0;
  uint local_2c8;
  Reader *local_2c0;
  uint local_2b8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_2b0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_2a0;
  TemporaryPointer<capnp::compiler::Token::Reader> local_290;
  Reader *local_260;
  uint local_258;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_250;
  TemporaryPointer<capnp::compiler::Token::Reader> local_240;
  StringPtr local_210;
  Reader *local_200;
  uint local_1f8;
  Reader *local_1f0;
  uint local_1e8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_1e0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_1d0;
  TemporaryPointer<capnp::compiler::Token::Reader> local_1c0;
  TemporaryPointer<capnp::compiler::Token::Reader> local_190;
  Reader *local_160;
  uint local_158;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_150;
  Reader *local_140;
  uint local_138;
  undefined1 local_130 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  undefined1 local_b8 [8];
  ParserInput input;
  undefined1 local_70 [8];
  Reader item;
  undefined1 local_38 [4];
  uint i;
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> result;
  Located<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader>
  *items_local;
  ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
  *this_local;
  
  result.disposer = (ArrayDisposer *)items;
  uVar6 = List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::size
                    (&items->value);
  kj::heapArray<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>>>
            ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)local_38,
             (kj *)(ulong)uVar6,size);
  for (item.reader._44_4_ = 0; uVar4 = item.reader._44_4_,
      uVar6 = List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::
              size((Reader *)result.disposer), (uint)uVar4 < uVar6;
      item.reader._44_4_ = item.reader._44_4_ + 1) {
    List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::operator[]
              ((Reader *)local_70,(Reader *)result.disposer,item.reader._44_4_);
    IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_70);
    IVar12 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
    IVar13._12_4_ = 0;
    IVar13.container = (Reader *)SUB128(IVar11._0_12_,0);
    IVar13.index = SUB124(IVar11._0_12_,8);
    end._12_4_ = 0;
    end.container = (Reader *)SUB128(IVar12._0_12_,0);
    end.index = SUB124(IVar12._0_12_,8);
    kj::parse::
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                     *)local_b8,IVar13,end);
    kj::parse::
    Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&,_const_kj::parse::EndOfInput__&>
    ::
    operator()<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
              ((Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)&best.index,
               &this->itemParser,
               (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                *)local_b8);
    pMVar9 = kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::operator[]
                       ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                        local_38,(ulong)(uint)item.reader._44_4_);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::operator=
              (pMVar9,(Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)&best.index);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::~Maybe
              ((Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)&best.index);
    pMVar9 = kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::operator[]
                       ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                        local_38,(ulong)(uint)item.reader._44_4_);
    bVar5 = kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::operator==
                      (pMVar9,(void *)0x0);
    if (bVar5) {
      IVar13 = kj::parse::
               IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
               ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                          *)local_b8);
      local_140 = IVar13.container;
      local_138 = IVar13.index;
      local_130 = (undefined1  [8])local_140;
      best.container._0_4_ = local_138;
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
      local_160 = IVar11.container;
      local_158 = IVar11.index;
      local_150.container = local_160;
      local_150.index = local_158;
      bVar5 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator<((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                           *)local_130,&local_150);
      if (bVar5) {
        pEVar3 = this->errorReporter;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_190,
                     (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                      *)local_130);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_190)
        ;
        uVar7 = Token::Reader::getStartByte(pRVar10);
        IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
        local_1f0 = IVar11.container;
        local_1e8 = IVar11.index;
        local_1e0.container = local_1f0;
        local_1e0.index = local_1e8;
        IVar13 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 ::operator-(&local_1e0,1);
        local_200 = IVar13.container;
        local_1f8 = IVar13.index;
        local_1d0.container = local_200;
        local_1d0.index = local_1f8;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_1c0,&local_1d0);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_1c0)
        ;
        uVar8 = Token::Reader::getEndByte(pRVar10);
        kj::StringPtr::StringPtr(&local_210,"Parse error.");
        (**pEVar3->_vptr_ErrorReporter)
                  (pEVar3,(ulong)uVar7,(ulong)uVar8,local_210.content.ptr,local_210.content.size_);
      }
      else {
        uVar6 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::size((Reader *)local_70);
        if (uVar6 == 0) {
          pEVar3 = this->errorReporter;
          uVar1 = *(uint *)&result.disposer[6]._vptr_ArrayDisposer;
          uVar2 = *(uint *)((long)&result.disposer[6]._vptr_ArrayDisposer + 4);
          kj::StringPtr::StringPtr(&local_2f0,"Parse error: Empty list item.");
          (**pEVar3->_vptr_ErrorReporter)
                    (pEVar3,(ulong)uVar1,(ulong)uVar2,local_2f0.content.ptr,local_2f0.content.size_)
          ;
        }
        else {
          pEVar3 = this->errorReporter;
          IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_70);
          local_260 = IVar11.container;
          local_258 = IVar11.index;
          local_250.container = local_260;
          local_250.index = local_258;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator->(&local_240,&local_250);
          pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->
                              (&local_240);
          uVar7 = Token::Reader::getStartByte(pRVar10);
          IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
          local_2c0 = IVar11.container;
          local_2b8 = IVar11.index;
          local_2b0.container = local_2c0;
          local_2b0.index = local_2b8;
          IVar13 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                   ::operator-(&local_2b0,1);
          local_2d0 = IVar13.container;
          local_2c8 = IVar13.index;
          local_2a0.container = local_2d0;
          local_2a0.index = local_2c8;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator->(&local_290,&local_2a0);
          pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->
                              (&local_290);
          uVar8 = Token::Reader::getEndByte(pRVar10);
          kj::StringPtr::StringPtr(&local_2e0,"Parse error.");
          (**pEVar3->_vptr_ErrorReporter)
                    (pEVar3,(ulong)uVar7,(ulong)uVar8,local_2e0.content.ptr,local_2e0.content.size_)
          ;
        }
      }
    }
    kj::parse::
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                      *)local_b8);
  }
  value = kj::mv<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>>>>
                    ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                     local_38);
  Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_>::Located
            (__return_storage_ptr__,value,*(uint32_t *)&result.disposer[6]._vptr_ArrayDisposer,
             *(uint32_t *)((long)&result.disposer[6]._vptr_ArrayDisposer + 4));
  kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::~Array
            ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Located<kj::Array<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>> operator()(
      Located<List<List<Token>>::Reader>&& items) const {
    auto result = kj::heapArray<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>(
        items.value.size());
    for (uint i = 0; i < items.value.size(); i++) {
      auto item = items.value[i];
      CapnpParser::ParserInput input(item.begin(), item.end());
      result[i] = itemParser(input);
      if (result[i] == nullptr) {
        // Parsing failed.  Report an error.
        auto best = input.getBest();
        if (best < item.end()) {
          // Report error from the point where parsing failed to the end of the item.
          errorReporter.addError(
              best->getStartByte(), (item.end() - 1)->getEndByte(), "Parse error.");
        } else if (item.size() > 0) {
          // The item is non-empty and the parser consumed all of it before failing.  Report an
          // error for the whole thing.
          errorReporter.addError(
              item.begin()->getStartByte(), (item.end() - 1)->getEndByte(), "Parse error.");
        } else {
          // The item has no content.
          // TODO(cleanup):  We don't actually know the item's location, so we can only report
          //   an error across the whole list.  Fix this.
          errorReporter.addError(items.startByte, items.endByte, "Parse error: Empty list item.");
        }
      }
    }
    return Located<kj::Array<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>>(
        kj::mv(result), items.startByte, items.endByte);
  }